

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenModuleOptimize(BinaryenModuleRef module)

{
  long lVar1;
  PassOptions *pPVar2;
  undefined8 *puVar3;
  undefined1 local_100 [120];
  __node_base_ptr *local_88;
  size_type local_80;
  __node_base local_78;
  size_type sStack_70;
  float local_68;
  size_t local_60;
  __node_base_ptr p_Stack_58;
  __node_base_ptr *local_50;
  size_type local_48;
  __node_base local_40;
  size_type sStack_38;
  float local_30;
  size_t local_28;
  __node_base_ptr p_Stack_20;
  undefined2 local_18;
  
  local_100._0_8_ = &PTR__PassRunner_010714e0;
  local_100._16_8_ = &module->allocator;
  local_100._24_8_ = (pointer)0x0;
  local_100._32_8_ = (pointer)0x0;
  local_100._40_8_ = (pointer)0x0;
  local_88 = &p_Stack_58;
  local_80 = 1;
  local_78._M_nxt = (_Hash_node_base *)0x0;
  sStack_70 = 0;
  local_68 = 1.0;
  local_60 = 0;
  p_Stack_58 = (__node_base_ptr)0x0;
  local_50 = &p_Stack_20;
  local_48 = 1;
  local_40._M_nxt = (_Hash_node_base *)0x0;
  sStack_38 = 0;
  local_30 = 1.0;
  local_28 = 0;
  p_Stack_20 = (__node_base_ptr)0x0;
  local_18._0_1_ = false;
  local_18._1_1_ = false;
  pPVar2 = &globalPassOptions;
  puVar3 = (undefined8 *)(local_100 + 0x30);
  for (lVar1 = 8; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)pPVar2;
    pPVar2 = (PassOptions *)&pPVar2->shrinkLevel;
    puVar3 = puVar3 + 1;
  }
  local_100[0x70] = globalPassOptions.targetJS;
  local_100._8_8_ = module;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_88,&globalPassOptions.arguments._M_h);
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_50,&globalPassOptions.passesToSkip._M_h);
  wasm::PassRunner::addDefaultOptimizationPasses((PassRunner *)local_100);
  wasm::PassRunner::run((PassRunner *)local_100);
  wasm::PassRunner::~PassRunner((PassRunner *)local_100);
  return;
}

Assistant:

void BinaryenModuleOptimize(BinaryenModuleRef module) {
  PassRunner passRunner((Module*)module);
  passRunner.options = globalPassOptions;
  passRunner.addDefaultOptimizationPasses();
  passRunner.run();
}